

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O2

Size_t __thiscall
cppurses::detail::Event_queue::View<(cppurses::Event::Type)10>::Move_iterator::find_next
          (Move_iterator *this,Size_t from)

{
  pthread_mutex_t *__mutex;
  __uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_> _Var1;
  pointer puVar2;
  key_type in_RAX;
  size_type sVar3;
  Size_t SVar4;
  Size_t SVar5;
  key_type local_38;
  
  __mutex = (pthread_mutex_t *)this->mtx_;
  local_38 = in_RAX;
  std::mutex::lock((mutex *)&__mutex->__data);
  SVar4 = (long)(this->events_->
                super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->events_->
                super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3;
  if (SVar4 != from) {
    for (SVar5 = from + 1; from = SVar4, SVar4 != SVar5; SVar5 = SVar5 + 1) {
      _Var1._M_t.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
      super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl =
           (this->events_->
           super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[SVar5]._M_t.
           super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>._M_t;
      if ((_Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
          _Var1._M_t.
          super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
          super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl != (Event *)0x0) {
        local_38 = *(key_type *)
                    ((long)_Var1._M_t.
                           super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
                           .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl + 0x10);
        sVar3 = std::
                set<cppurses::Widget_*,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
                ::count(&this->already_sent_,&local_38);
        if (sVar3 == 0) {
          local_38 = *(key_type *)
                      ((long)(this->events_->
                             super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[SVar5]._M_t.
                             super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>
                             ._M_t + 0x10);
          std::
          _Rb_tree<cppurses::Widget*,cppurses::Widget*,std::_Identity<cppurses::Widget*>,std::less<cppurses::Widget*>,std::allocator<cppurses::Widget*>>
          ::_M_insert_unique<cppurses::Widget*>
                    ((_Rb_tree<cppurses::Widget*,cppurses::Widget*,std::_Identity<cppurses::Widget*>,std::less<cppurses::Widget*>,std::allocator<cppurses::Widget*>>
                      *)&this->already_sent_,&local_38);
          from = SVar5;
          break;
        }
        puVar2 = (this->events_->
                 super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        _Var1._M_t.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
        super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl =
             puVar2[SVar5]._M_t.
             super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>._M_t;
        puVar2[SVar5]._M_t.
        super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>._M_t =
             (tuple<cppurses::Event_*,_std::default_delete<cppurses::Event>_>)0x0;
        if ((_Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
            _Var1._M_t.
            super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
            super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl != (Event *)0x0) {
          (**(code **)(*(long *)_Var1._M_t.
                                super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
                                .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl + 8))
                    ();
        }
      }
    }
  }
  pthread_mutex_unlock(__mutex);
  return from;
}

Assistant:

inline auto Event_queue::View<Event::Paint>::Move_iterator::find_next(
    Size_t from) -> Size_t
{
    Guard_t g{mtx_};
    const auto end = events_.size();
    if (from == end)
        return from;
    while (++from != end) {
        if (events_[from] == nullptr)
            continue;
        if (already_sent_.count(&(events_[from]->receiver())) > 0) {
            events_[from].reset(nullptr);
            continue;
        }
        already_sent_.insert(&(events_[from]->receiver()));
        break;
    }
    return from;
}